

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

void sat_solver2_reducedb(sat_solver2 *s)

{
  cla *pcVar1;
  Prf_Man_t *p;
  uint nSize;
  int iVar2;
  int iVar3;
  int iVar4;
  cla cVar5;
  int iVar6;
  uint uVar7;
  Sat_Mem_t *p_00;
  int *piVar8;
  abctime aVar9;
  int *pCosts;
  abctime aVar10;
  bool bVar11;
  int *local_c0;
  int *pArray;
  abctime clk;
  uint local_68;
  int CounterStart;
  int Counter;
  int nSelected;
  int Id;
  int k;
  int j;
  int i;
  int *pClaProofs;
  int nCutoffValue;
  int *pSortValues;
  int *pPerm;
  int *act_clas;
  clause *pcStack_20;
  int nLearnedOld;
  clause *c;
  Sat_Mem_t *pMem;
  sat_solver2 *s_local;
  
  p_00 = &s->Mem;
  pcStack_20 = (clause *)0x0;
  nSize = veci_size(&s->act_clas);
  piVar8 = veci_begin(&s->act_clas);
  aVar9 = Abc_Clock();
  sat_solver2_reducedb::Count = sat_solver2_reducedb::Count + 1;
  if (s->nLearntMax == 0) {
    __assert_fail("s->nLearntMax",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x58b,"void sat_solver2_reducedb(sat_solver2 *)");
  }
  s->nDBreduces = s->nDBreduces + 1;
  s->nLearntMax = s->nLearntStart + s->nLearntDelta * s->nDBreduces;
  iVar2 = nSize - s->nLearntMax / 0x14;
  iVar6 = s->nLearntRatio;
  pCosts = (int *)malloc((long)(int)nSize << 2);
  for (k = 1; k <= (s->Mem).iPage[1]; k = k + 2) {
    nSelected = 2;
    while( true ) {
      iVar3 = Sat_MemLimit((s->Mem).pPages[k]);
      bVar11 = false;
      if (nSelected < iVar3) {
        pcStack_20 = Sat_MemClause(p_00,k,nSelected);
        bVar11 = pcStack_20 != (clause *)0x0;
      }
      if (!bVar11) break;
      iVar3 = clause_id(pcStack_20);
      iVar4 = Abc_MinInt((uint)*pcStack_20 >> 3 & 0xff,7);
      pCosts[iVar3] = (7 - iVar4) * 0x10000000 | piVar8[iVar3] >> 4;
      if (pCosts[iVar3] < 0) {
        __assert_fail("pSortValues[Id] >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,0x5ab,"void sat_solver2_reducedb(sat_solver2 *)");
      }
      iVar3 = Sat_MemClauseSize(pcStack_20);
      nSelected = iVar3 + nSelected;
    }
  }
  piVar8 = Abc_MergeSortCost(pCosts,nSize);
  if (pCosts[piVar8[(int)(nSize - 1)]] < pCosts[*piVar8]) {
    __assert_fail("pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]]",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x5af,"void sat_solver2_reducedb(sat_solver2 *)");
  }
  iVar6 = pCosts[piVar8[(int)(nSize - (int)(nSize * iVar6) / 100)]];
  if (piVar8 != (int *)0x0) {
    free(piVar8);
  }
  Id = 0;
  local_68 = 0;
  k = 1;
  do {
    if ((s->Mem).iPage[1] < k) {
      if (Id < (int)nSize / 6) {
        if (pCosts != (int *)0x0) {
          free(pCosts);
        }
      }
      else {
        Id = 0;
        local_68 = 0;
        iVar3 = veci_size(&s->claProofs);
        if (iVar3 == 0) {
          local_c0 = (int *)0x0;
        }
        else {
          local_c0 = veci_begin(&s->claProofs);
        }
        for (k = 1; k <= (s->Mem).iPage[1]; k = k + 2) {
          nSelected = 2;
          while( true ) {
            iVar3 = Sat_MemLimit((s->Mem).pPages[k]);
            bVar11 = false;
            if (nSelected < iVar3) {
              pcStack_20 = Sat_MemClause(p_00,k,nSelected);
              bVar11 = pcStack_20 != (clause *)0x0;
            }
            if (!bVar11) break;
            if (((uint)*pcStack_20 >> 1 & 1) != 0) {
              __assert_fail("c->mark == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                            ,0x5cc,"void sat_solver2_reducedb(sat_solver2 *)");
            }
            if (((iVar2 < (int)local_68) || (iVar3 = clause_size(pcStack_20), iVar3 < 2)) ||
               (iVar3 = clause_id(pcStack_20), iVar6 <= pCosts[iVar3])) {
LAB_0066529c:
              iVar3 = clause_id(pcStack_20);
              pCosts[Id] = pCosts[iVar3];
              if (local_c0 != (int *)0x0) {
                iVar3 = clause_id(pcStack_20);
                local_c0[Id] = local_c0[iVar3];
              }
              if (s->pPrf2 != (Prf_Man_t *)0x0) {
                p = s->pPrf2;
                iVar3 = clause_id(pcStack_20);
                Prf_ManAddSaved(p,iVar3,Id);
              }
              Id = Id + 1;
            }
            else {
              pcVar1 = s->reasons;
              iVar3 = lit_var((lit)pcStack_20[1]);
              iVar3 = pcVar1[iVar3];
              cVar5 = Sat_MemHand(p_00,k,nSelected);
              if (iVar3 == cVar5) goto LAB_0066529c;
              *pcStack_20 = (clause)((uint)*pcStack_20 & 0xfffffffd | 2);
              iVar3 = clause_size(pcStack_20);
              (s->stats).learnts_literals = (s->stats).learnts_literals - (long)iVar3;
              (s->stats).learnts = (s->stats).learnts - 1;
            }
            iVar3 = Sat_MemClauseSize(pcStack_20);
            nSelected = iVar3 + nSelected;
            local_68 = local_68 + 1;
          }
        }
        if (pCosts != (int *)0x0) {
          free(pCosts);
        }
        if (s->pPrf2 != (Prf_Man_t *)0x0) {
          Prf_ManCompact(s->pPrf2,Id);
        }
        if ((s->stats).learnts != Id) {
          __assert_fail("s->stats.learnts == (unsigned)j",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                        ,0x5e3,"void sat_solver2_reducedb(sat_solver2 *)");
        }
        if (local_68 != nSize) {
          __assert_fail("Counter == nLearnedOld",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                        ,0x5e4,"void sat_solver2_reducedb(sat_solver2 *)");
        }
        veci_resize(&s->act_clas,Id);
        iVar6 = veci_size(&s->claProofs);
        if (iVar6 != 0) {
          veci_resize(&s->claProofs,Id);
        }
        uVar7 = Sat_MemCompactLearned(p_00,0);
        if (uVar7 != (s->stats).learnts) {
          __assert_fail("Counter == (int)s->stats.learnts",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                        ,0x5eb,"void sat_solver2_reducedb(sat_solver2 *)");
        }
        for (k = 0; k < s->size; k = k + 1) {
          if (((s->reasons[k] != 0) && (iVar6 = clause_is_lit(s->reasons[k]), iVar6 == 0)) &&
             (iVar6 = clause_learnt_h(p_00,s->reasons[k]), iVar6 != 0)) {
            if (((uint)*pcStack_20 & 1) == 0) {
              __assert_fail("c->lrn",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                            ,0x5f6,"void sat_solver2_reducedb(sat_solver2 *)");
            }
            pcStack_20 = clause2_read(s,s->reasons[k]);
            if (((uint)*pcStack_20 >> 1 & 1) != 0) {
              __assert_fail("c->mark == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                            ,0x5f8,"void sat_solver2_reducedb(sat_solver2 *)");
            }
            iVar6 = clause_id(pcStack_20);
            s->reasons[k] = iVar6;
          }
        }
        for (k = 0; SBORROW4(k,s->size * 2) != k + s->size * -2 < 0; k = k + 1) {
          piVar8 = veci_begin(s->wlists + k);
          Id = 0;
          for (nSelected = 0; iVar6 = veci_size(s->wlists + k), nSelected < iVar6;
              nSelected = nSelected + 1) {
            iVar6 = clause_is_lit(piVar8[nSelected]);
            if (iVar6 == 0) {
              iVar6 = clause_learnt_h(p_00,piVar8[nSelected]);
              if (iVar6 == 0) {
                piVar8[Id] = piVar8[nSelected];
                Id = Id + 1;
              }
              else {
                if (((uint)*pcStack_20 & 1) == 0) {
                  __assert_fail("c->lrn",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                                ,0x608,"void sat_solver2_reducedb(sat_solver2 *)");
                }
                pcStack_20 = clause2_read(s,piVar8[nSelected]);
                if (((uint)*pcStack_20 >> 1 & 1) == 0) {
                  iVar6 = clause_id(pcStack_20);
                  piVar8[Id] = iVar6;
                  Id = Id + 1;
                }
              }
            }
            else {
              piVar8[Id] = piVar8[nSelected];
              Id = Id + 1;
            }
          }
          veci_resize(s->wlists + k,Id);
        }
        if (s->fProofLogging != 0) {
          for (k = 0; k < s->size; k = k + 1) {
            if ((s->units[k] != 0) && (iVar6 = clause_learnt_h(p_00,s->units[k]), iVar6 != 0)) {
              if (((uint)*pcStack_20 & 1) == 0) {
                __assert_fail("c->lrn",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                              ,0x616,"void sat_solver2_reducedb(sat_solver2 *)");
              }
              pcStack_20 = clause2_read(s,s->units[k]);
              if (((uint)*pcStack_20 >> 1 & 1) != 0) {
                __assert_fail("c->mark == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                              ,0x618,"void sat_solver2_reducedb(sat_solver2 *)");
              }
              iVar6 = clause_id(pcStack_20);
              s->units[k] = iVar6;
            }
          }
        }
        uVar7 = Sat_MemCompactLearned(p_00,1);
        if (uVar7 != (s->stats).learnts) {
          __assert_fail("Counter == (int)s->stats.learnts",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                        ,0x61e,"void sat_solver2_reducedb(sat_solver2 *)");
        }
        if (s->pPrf1 != (Vec_Set_t *)0x0) {
          iVar6 = Sat_ProofReduce(s->pPrf1,&s->claProofs,s->hProofPivot);
          s->hProofPivot = iVar6;
        }
        aVar10 = Abc_Clock();
        sat_solver2_reducedb::TimeTotal = (aVar10 - aVar9) + sat_solver2_reducedb::TimeTotal;
        if (s->fVerbose != 0) {
          uVar7 = (s->stats).learnts;
          Abc_Print(1,"reduceDB: Keeping %7d out of %7d clauses (%5.2f %%)  ",
                    ((double)uVar7 * 100.0) / (double)(int)nSize,(ulong)uVar7,(ulong)nSize);
          Abc_PrintTime(1,"Time",sat_solver2_reducedb::TimeTotal);
        }
      }
      return;
    }
    nSelected = 2;
    while( true ) {
      iVar3 = Sat_MemLimit((s->Mem).pPages[k]);
      bVar11 = false;
      if (nSelected < iVar3) {
        pcStack_20 = Sat_MemClause(p_00,k,nSelected);
        bVar11 = pcStack_20 != (clause *)0x0;
      }
      if (!bVar11) break;
      if (((uint)*pcStack_20 >> 1 & 1) != 0) {
        __assert_fail("c->mark == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,0x5b8,"void sat_solver2_reducedb(sat_solver2 *)");
      }
      iVar3 = local_68 + 1;
      if ((((int)local_68 <= iVar2) && (iVar4 = clause_size(pcStack_20), 1 < iVar4)) &&
         (iVar4 = clause_id(pcStack_20), pCosts[iVar4] < iVar6)) {
        pcVar1 = s->reasons;
        iVar4 = lit_var((lit)pcStack_20[1]);
        iVar4 = pcVar1[iVar4];
        cVar5 = Sat_MemHand(p_00,k,nSelected);
        if (iVar4 != cVar5) {
          Id = Id + 1;
        }
      }
      local_68 = iVar3;
      if ((int)nSize / 6 <= Id) break;
      iVar3 = Sat_MemClauseSize(pcStack_20);
      nSelected = iVar3 + nSelected;
    }
    k = k + 2;
  } while( true );
}

Assistant:

void sat_solver2_reducedb(sat_solver2* s)
{
    static abctime TimeTotal = 0;
    Sat_Mem_t * pMem = &s->Mem;
    clause * c = NULL;
    int nLearnedOld = veci_size(&s->act_clas);
    int * act_clas = veci_begin(&s->act_clas);
    int * pPerm, * pSortValues, nCutoffValue, * pClaProofs;
    int i, j, k, Id, nSelected;//, LastSize = 0;
    int Counter, CounterStart;
    abctime clk = Abc_Clock();
    static int Count = 0;
    Count++;
    assert( s->nLearntMax );
    s->nDBreduces++;
//    printf( "Calling reduceDB with %d clause limit and parameters (%d %d %d).\n", s->nLearntMax, s->nLearntStart, s->nLearntDelta, s->nLearntRatio );

/*
    // find the new limit
    s->nLearntMax = s->nLearntMax * 11 / 10;
    // preserve 1/10 of last clauses
    CounterStart  = s->stats.learnts - (s->nLearntMax / 10);
    // preserve 1/10 of most active clauses
    pSortValues = veci_begin(&s->act_clas);
    pPerm = Abc_MergeSortCost( pSortValues, nLearnedOld );
    assert( pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]] );
    nCutoffValue = pSortValues[pPerm[nLearnedOld*9/10]];
    ABC_FREE( pPerm );
//    nCutoffValue = ABC_INFINITY;
*/


    // find the new limit
    s->nLearntMax = s->nLearntStart + s->nLearntDelta * s->nDBreduces;
    // preserve 1/20 of last clauses
    CounterStart  = nLearnedOld - (s->nLearntMax / 20);
    // preserve 3/4 of most active clauses
    nSelected = nLearnedOld*s->nLearntRatio/100;
    // create sorting values
    pSortValues = ABC_ALLOC( int, nLearnedOld );
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        Id = clause_id(c);
        pSortValues[Id] = (((7 - Abc_MinInt(c->lbd, 7)) << 28) | (act_clas[Id] >> 4));
//        pSortValues[Id] = act_clas[Id];
        assert( pSortValues[Id] >= 0 );
    }
    // find non-decreasing permutation
    pPerm = Abc_MergeSortCost( pSortValues, nLearnedOld );
    assert( pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]] );
    nCutoffValue = pSortValues[pPerm[nLearnedOld-nSelected]];
    ABC_FREE( pPerm );
//    nCutoffValue = ABC_INFINITY;

    // count how many clauses satisfy the condition
    Counter = j = 0;
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        assert( c->mark == 0 );
        if ( Counter++ > CounterStart || clause_size(c) < 2 || pSortValues[clause_id(c)] >= nCutoffValue || s->reasons[lit_var(c->lits[0])] == Sat_MemHand(pMem, i, k) )
        {
        }
        else
            j++;
        if ( j >= nLearnedOld / 6 )
            break;
    }
    if ( j < nLearnedOld / 6 )
    {
        ABC_FREE( pSortValues );
        return;
    }

    // mark learned clauses to remove
    Counter = j = 0;
    pClaProofs = veci_size(&s->claProofs) ? veci_begin(&s->claProofs) : NULL;
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        assert( c->mark == 0 );
        if ( Counter++ > CounterStart || clause_size(c) < 2 || pSortValues[clause_id(c)] >= nCutoffValue || s->reasons[lit_var(c->lits[0])] == Sat_MemHand(pMem, i, k) )
        {
            pSortValues[j] = pSortValues[clause_id(c)];
            if ( pClaProofs ) 
                pClaProofs[j] = pClaProofs[clause_id(c)];
            if ( s->pPrf2 )
                Prf_ManAddSaved( s->pPrf2, clause_id(c), j );
            j++;
        }
        else // delete
        {
            c->mark = 1;
            s->stats.learnts_literals -= clause_size(c);
            s->stats.learnts--;
        }
    }
    ABC_FREE( pSortValues );
    if ( s->pPrf2 )
        Prf_ManCompact( s->pPrf2, j );
//    if ( j == nLearnedOld )
//        return;

    assert( s->stats.learnts == (unsigned)j );
    assert( Counter == nLearnedOld );
    veci_resize(&s->act_clas,j);
    if ( veci_size(&s->claProofs) )
        veci_resize(&s->claProofs,j);

    // update ID of each clause to be its new handle
    Counter = Sat_MemCompactLearned( pMem, 0 );
    assert( Counter == (int)s->stats.learnts );

    // update reasons
    for ( i = 0; i < s->size; i++ )
    {
        if ( !s->reasons[i] ) // no reason
            continue;
        if ( clause_is_lit(s->reasons[i]) ) // 2-lit clause
            continue;
        if ( !clause_learnt_h(pMem, s->reasons[i]) ) // problem clause
            continue;
        assert( c->lrn );
        c = clause2_read( s, s->reasons[i] );
        assert( c->mark == 0 );
        s->reasons[i] = clause_id(c); // updating handle here!!!
    }

    // update watches
    for ( i = 0; i < s->size*2; i++ )
    {
        int * pArray = veci_begin(&s->wlists[i]);
        for ( j = k = 0; k < veci_size(&s->wlists[i]); k++ )
        {
            if ( clause_is_lit(pArray[k]) ) // 2-lit clause
                pArray[j++] = pArray[k];
            else if ( !clause_learnt_h(pMem, pArray[k]) ) // problem clause
                pArray[j++] = pArray[k];
            else 
            {
                assert( c->lrn );
                c = clause2_read(s, pArray[k]);
                if ( !c->mark ) // useful learned clause
                   pArray[j++] = clause_id(c); // updating handle here!!!
            }
        }
        veci_resize(&s->wlists[i],j);
    }

    // compact units
    if ( s->fProofLogging )
        for ( i = 0; i < s->size; i++ )
            if ( s->units[i] && clause_learnt_h(pMem, s->units[i]) )
            {
                assert( c->lrn );
                c = clause2_read( s, s->units[i] );
                assert( c->mark == 0 );
                s->units[i] = clause_id(c);
            }

    // perform final move of the clauses
    Counter = Sat_MemCompactLearned( pMem, 1 );
    assert( Counter == (int)s->stats.learnts );

    // compact proof (compacts 'proofs' and update 'claProofs')
    if ( s->pPrf1 )
    {
        extern int Sat_ProofReduce( Vec_Set_t * vProof, void * pRoots, int hProofPivot );
        s->hProofPivot = Sat_ProofReduce( s->pPrf1, &s->claProofs, s->hProofPivot );
    }

    // report the results
    TimeTotal += Abc_Clock() - clk;
    if ( s->fVerbose )
    {
        Abc_Print(1, "reduceDB: Keeping %7d out of %7d clauses (%5.2f %%)  ",
            s->stats.learnts, nLearnedOld, 100.0 * s->stats.learnts / nLearnedOld );
        Abc_PrintTime( 1, "Time", TimeTotal );
    }
}